

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_Tt6Isop(word uOn,word uOnDc,int nVars,int *pnCubes)

{
  ulong uVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  word wVar5;
  byte bVar6;
  ulong uOnDc_00;
  ulong uVar7;
  ulong uOnDc_01;
  ulong uVar8;
  uint iVar;
  ulong uVar9;
  
  if (6 < nVars) {
    __assert_fail("nVars <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x7dc,"word Abc_Tt6Isop(word, word, int, int *)");
  }
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x7dd,"word Abc_Tt6Isop(word, word, int, int *)");
  }
  if (uOn == 0) {
    wVar5 = 0;
  }
  else if (uOnDc == 0xffffffffffffffff) {
    *pnCubes = *pnCubes + 1;
    wVar5 = 0xffffffffffffffff;
  }
  else {
    uVar9 = (ulong)(uint)nVars;
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x7e5,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    do {
      if ((int)uVar9 < 1) {
        __assert_fail("Var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                      ,0x7ea,"word Abc_Tt6Isop(word, word, int, int *)");
      }
      iVar = (int)uVar9 - 1;
      uVar9 = (ulong)iVar;
      iVar2 = Abc_Tt6HasVar(uOn,iVar);
    } while ((iVar2 == 0) && (iVar2 = Abc_Tt6HasVar(uOnDc,iVar), iVar2 == 0));
    uVar1 = s_Truths6Neg[uVar9];
    bVar6 = (byte)(1 << ((byte)iVar & 0x1f));
    uVar9 = s_Truths6[uVar9];
    uVar7 = (uVar1 & uOn) << (bVar6 & 0x3f) | uVar1 & uOn;
    uVar8 = (uVar9 & uOn) >> (bVar6 & 0x3f) | uVar9 & uOn;
    uOnDc_01 = (uVar1 & uOnDc) << (bVar6 & 0x3f) | uVar1 & uOnDc;
    uOnDc_00 = (uOnDc & uVar9) >> (bVar6 & 0x3f) | uOnDc & uVar9;
    wVar3 = Abc_Tt6Isop(~uOnDc_00 & uVar7,uOnDc_01,iVar,pnCubes);
    wVar4 = Abc_Tt6Isop(~uOnDc_01 & uVar8,uOnDc_00,iVar,pnCubes);
    wVar5 = Abc_Tt6Isop(~wVar4 & uVar8 | ~wVar3 & uVar7,uOnDc_00 & uOnDc_01,iVar,pnCubes);
    wVar5 = wVar4 & uVar9 | wVar3 & uVar1 | wVar5;
    if ((~wVar5 & uOn) != 0) {
      __assert_fail("(uOn & ~uRes2) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x7f6,"word Abc_Tt6Isop(word, word, int, int *)");
    }
    if ((~uOnDc & wVar5) != 0) {
      __assert_fail("(uRes2 & ~uOnDc) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x7f7,"word Abc_Tt6Isop(word, word, int, int *)");
    }
  }
  return wVar5;
}

Assistant:

static inline word Abc_Tt6Isop( word uOn, word uOnDc, int nVars, int * pnCubes )
{
    word uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int Var;
    assert( nVars <= 6 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
        return 0;
    if ( uOnDc == ~(word)0 )
    {
        (*pnCubes)++;
        return ~(word)0;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt6HasVar( uOn, Var ) || Abc_Tt6HasVar( uOnDc, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = Abc_Tt6Cofactor0( uOn,   Var );
    uOn1   = Abc_Tt6Cofactor1( uOn  , Var );
    uOnDc0 = Abc_Tt6Cofactor0( uOnDc, Var );
    uOnDc1 = Abc_Tt6Cofactor1( uOnDc, Var );
    // solve for cofactors
    uRes0 = Abc_Tt6Isop( uOn0 & ~uOnDc1, uOnDc0, Var, pnCubes );
    uRes1 = Abc_Tt6Isop( uOn1 & ~uOnDc0, uOnDc1, Var, pnCubes );
    uRes2 = Abc_Tt6Isop( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pnCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & s_Truths6Neg[Var]) | (uRes1 & s_Truths6[Var]);
    assert( (uOn & ~uRes2) == 0 );
    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}